

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O1

void __thiscall Poll::unsubscribe(Poll *this,Subscriber *sub)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  pointer ppVar3;
  int iVar4;
  pollfd *i;
  pointer ppVar5;
  ulong uVar6;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false> __it;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  vector<pollfd,_std::allocator<pollfd>_> *__range1;
  
  iVar4 = Subscriber::get_fd(sub);
  uVar1 = (this->subs)._M_h._M_bucket_count;
  uVar6 = (ulong)(long)iVar4 % uVar1;
  p_Var7 = (this->subs)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, iVar4 != *(int *)&p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, iVar4 == *(int *)&p_Var2[1]._M_nxt)) goto LAB_0010b089;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0010b089:
  if (p_Var8 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var8->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->subs)._M_h,(const_iterator)__it._M_cur);
    ppVar3 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar5 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                  super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1) {
      if (ppVar5->fd == iVar4) {
        ppVar5->fd = -0x80000000;
      }
    }
  }
  return;
}

Assistant:

void Poll::unsubscribe(Subscriber &sub) {
  int fd = sub.get_fd();
  auto it = subs.find(fd);
  if (it == this->subs.end()) {
    return;
  }
  this->subs.erase(it);
  for (auto &i: this->fds) { //TODO remove not needed fds
    if (i.fd == fd) {
      i.fd = DELETED;
      if (i.fd == 0) i.fd = -1;
    }
  }
}